

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AI.cpp
# Opt level: O2

void AI::recommendHitForPlayer(Player *player,int *recommendedHit)

{
  bool bVar1;
  short sVar2;
  time_t tVar3;
  ostream *poVar4;
  int iVar5;
  int j;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  recommendedHit[0] = -1;
  recommendedHit[1] = -1;
  iVar5 = 1;
  do {
    if (iVar5 == 0xb) {
      do {
        iVar5 = rand();
        *recommendedHit = iVar5 % 10 + 1;
        iVar5 = rand();
        iVar5 = iVar5 % 10 + 1;
        recommendedHit[1] = iVar5;
        sVar2 = Player::getEnemyCellInfo(player,*recommendedHit,iVar5);
      } while (sVar2 != 0);
      return;
    }
    for (j = 1; j != 0xb; j = j + 1) {
      sVar2 = Player::getEnemyCellInfo(player,iVar5,j);
      if ((sVar2 == 300) && (bVar1 = unknownCellsNearby(player,iVar5,j), bVar1)) {
        findUnknownCellNearby(player,iVar5,j,recommendedHit);
        poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar4 = std::operator<<(poVar4,"found?: ");
        poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        std::endl<char,std::char_traits<char>>(poVar4);
        Keyboard::getch();
        return;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void AI::recommendHitForPlayer(Player & player, int * recommendedHit) {
    srand(time(NULL));
    recommendedHit[0] = -1;
    recommendedHit[1] = -1;
    bool found = false;
    for(int i = 1; i <= 10; i++)
    {
        for(int j = 1; j <= 10; j++)
        {
            if (player.getEnemyCellInfo(i,j) == Player::SHOOT_CODE && unknownCellsNearby(player, i, j))
            {
                findUnknownCellNearby(player, i, j, recommendedHit);

                found = true;
                std::cout << std::endl << "found?: " <<found << std::endl;
                Keyboard::getch();
                break;
            }
        }
        if(found) break;
    }
    //std::cout << std::endl << "found?: " << (char*) found << std::endl;
    if (!found)
    {

        recommendedHit[0] = rand() % 10 + 1;
        recommendedHit[1] = rand() % 10 + 1;
        while(player.getEnemyCellInfo(recommendedHit[0],recommendedHit[1]) != Player::UNKNOWN_CODE)
        {
            recommendedHit[0] = rand() % 10 + 1;
            recommendedHit[1] = rand() % 10 + 1;
        }
    }
}